

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Acceptor.h
# Opt level: O2

void __thiscall AcceptException::~AcceptException(AcceptException *this)

{
  ~AcceptException(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

AcceptException(std::string description) :
            description(std::move(description)) {}